

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::NativeObjects::NativeObjects
          (NativeObjects *this,Context *context,Extensions *supportedExtensions,Type wsiType,
          Maybe<tcu::Vector<unsigned_int,_2>_> *initialWindowSize)

{
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> data;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> data_00;
  int iVar1;
  TestContext *this_00;
  Platform *pPVar2;
  undefined4 extraout_var;
  Display *display;
  Display *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> local_80;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *local_70;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> local_50;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *local_40;
  Maybe<tcu::Vector<unsigned_int,_2>_> *local_30;
  Maybe<tcu::Vector<unsigned_int,_2>_> *initialWindowSize_local;
  Extensions *pEStack_20;
  Type wsiType_local;
  Extensions *supportedExtensions_local;
  Context *context_local;
  NativeObjects *this_local;
  MovePtr *this_01;
  
  local_30 = initialWindowSize;
  initialWindowSize_local._4_4_ = wsiType;
  pEStack_20 = supportedExtensions;
  supportedExtensions_local = (Extensions *)context;
  context_local = (Context *)this;
  this_00 = Context::getTestContext(context);
  pPVar2 = tcu::TestContext::getPlatform(this_00);
  iVar1 = (*pPVar2->_vptr_Platform[5])();
  this_01 = (MovePtr *)CONCAT44(extraout_var,iVar1);
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_50,
                (Platform *)this_01,pEStack_20,initialWindowSize_local._4_4_);
  local_40 = de::details::MovePtr::operator_cast_to_PtrData(&local_50,this_01);
  data._8_8_ = in_stack_ffffffffffffff50;
  data.ptr = in_stack_ffffffffffffff48;
  de::details::UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::UniquePtr
            (&this->display,data);
  de::details::MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~MovePtr
            ((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_50);
  display = de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::
            operator*((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)this);
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_80,display,
               local_30);
  local_70 = de::details::MovePtr::operator_cast_to_PtrData(&local_80,(MovePtr *)display);
  data_00._8_8_ = local_70;
  data_00.ptr = (Window *)in_stack_ffffffffffffff48;
  de::details::UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::UniquePtr
            (&this->window,data_00);
  de::details::MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~MovePtr
            ((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_80);
  return;
}

Assistant:

NativeObjects (Context&				context,
				   const Extensions&	supportedExtensions,
				   Type					wsiType,
				   const Maybe<UVec2>&	initialWindowSize = tcu::nothing<UVec2>())
		: display	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(), supportedExtensions, wsiType))
		, window	(createWindow(*display, initialWindowSize))
	{}